

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *s)

{
  char *pcVar1;
  ulong in_RCX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  EpsCopyInputStream *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  pcVar1 = in_RDI;
  std::__cxx11::string::clear();
  if ((long)in_EDX <= (*(long *)(in_RDI + 8) - in_RSI) + (long)*(int *)(in_RDI + 0x1c)) {
    std::__cxx11::string::reserve(in_RCX);
  }
  pcVar1 = AppendStringFallback
                     (unaff_retaddr,pcVar1,(int)((ulong)in_RSI >> 0x20),
                      (string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::ReadStringFallback(const char* ptr, int size,
                                                   std::string* s) {
  s->clear();
  // TODO(gerbens) assess security. At the moment its parity with
  // CodedInputStream but it allows a payload to reserve large memory.
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    s->reserve(size);
  }
  return AppendStringFallback(ptr, size, s);
}